

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistatstest.cpp
# Opt level: O0

void test_stringparser_updatewidthnumber(void)

{
  ostream *poVar1;
  runtime_error *prVar2;
  string local_a38 [32];
  stringstream local_a18 [8];
  stringstream msg_5;
  ostream local_a08 [383];
  undefined1 local_889;
  string local_888 [32];
  stringstream local_868 [8];
  stringstream msg_4;
  ostream local_858 [383];
  undefined1 local_6d9;
  string local_6d8 [32];
  stringstream local_6b8 [8];
  stringstream msg_3;
  ostream local_6a8 [383];
  undefined1 local_529;
  string local_528 [32];
  stringstream local_508 [8];
  stringstream msg_2;
  ostream local_4f8 [383];
  undefined1 local_379;
  string local_378 [32];
  stringstream local_358 [8];
  stringstream msg_1;
  ostream local_348 [383];
  undefined1 local_1c9;
  string local_1c8 [48];
  stringstream local_198 [8];
  stringstream msg;
  ostream local_188 [376];
  long local_10;
  long width;
  
  local_10 = 0;
  StringParser::updateWidthNumber<short>(1,&local_10);
  if (local_10 != 1) {
    std::__cxx11::stringstream::stringstream(local_198);
    poVar1 = std::operator<<(local_188,"StringParser::updateWidthNumber failed on updating short");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_1c9 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar2,local_1c8);
    local_1c9 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  StringParser::updateWidthNumber<int>(1,&local_10);
  if (local_10 != 1) {
    std::__cxx11::stringstream::stringstream(local_358);
    poVar1 = std::operator<<(local_348,"StringParser::updateWidthNumber failed on updating int");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_379 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar2,local_378);
    local_379 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  StringParser::updateWidthNumber<long>(1,&local_10);
  if (local_10 != 1) {
    std::__cxx11::stringstream::stringstream(local_508);
    poVar1 = std::operator<<(local_4f8,"StringParser::updateWidthNumber failed on updating long");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_529 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar2,local_528);
    local_529 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  StringParser::updateWidthNumber<long_long>(1,&local_10);
  if (local_10 != 1) {
    std::__cxx11::stringstream::stringstream(local_6b8);
    poVar1 = std::operator<<(local_6a8,
                             "StringParser::updateWidthNumber failed on updating long long");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_6d9 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar2,local_6d8);
    local_6d9 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  StringParser::updateWidthNumber<float>(1.0,&local_10);
  if (local_10 != 8) {
    std::__cxx11::stringstream::stringstream(local_868);
    poVar1 = std::operator<<(local_858,"StringParser::updateWidthNumber failed on updating float");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_889 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar2,local_888);
    local_889 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  StringParser::updateWidthNumber<double>(1.0,&local_10);
  if (local_10 != 8) {
    std::__cxx11::stringstream::stringstream(local_a18);
    poVar1 = std::operator<<(local_a08,"StringParser::updateWidthNumber failed on updating double");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar2,local_a38);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void test_stringparser_updatewidthnumber()
{

    long width = 0;
    StringParser::updateWidthNumber<short>(1, width);
    ASSERT_EQUAL(width, 1, "StringParser::updateWidthNumber failed on updating short");
    StringParser::updateWidthNumber<int>(1, width);
    ASSERT_EQUAL(width, 1, "StringParser::updateWidthNumber failed on updating int");
    StringParser::updateWidthNumber<long>(1, width);
    ASSERT_EQUAL(width, 1, "StringParser::updateWidthNumber failed on updating long");
    StringParser::updateWidthNumber<long long>(1, width);
    ASSERT_EQUAL(width, 1, "StringParser::updateWidthNumber failed on updating long long");
    StringParser::updateWidthNumber<float>(1, width);
    ASSERT_EQUAL(width, 8, "StringParser::updateWidthNumber failed on updating float");
    StringParser::updateWidthNumber<double>(1, width);
    ASSERT_EQUAL(width, 8, "StringParser::updateWidthNumber failed on updating double");

}